

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_return.hpp
# Opt level: O2

Boxed_Value
chaiscript::dispatch::detail::Handle_Return<chaiscript::dispatch::Dynamic_Object>::
handle<chaiscript::dispatch::Dynamic_Object,void>(Dynamic_Object *r)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  
  std::make_shared<chaiscript::dispatch::Dynamic_Object,chaiscript::dispatch::Dynamic_Object>
            ((Dynamic_Object *)&stack0xffffffffffffffe0);
  Boxed_Value::Object_Data::get<chaiscript::dispatch::Dynamic_Object>
            ((Object_Data *)r,
             (shared_ptr<chaiscript::dispatch::Dynamic_Object> *)&stack0xffffffffffffffe0,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)r;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value handle(T &&r) {
          return Boxed_Value(std::make_shared<T>(std::forward<T>(r)), true);
        }